

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

String * __thiscall
asl::Console::rgb(String *__return_storage_ptr__,Console *this,int r,int g,int b)

{
  int iVar1;
  ulong uVar2;
  
  if (this->_colorMode == 2) {
    if (r < 1) {
      r = 0;
    }
    uVar2 = (ulong)(uint)r;
    if (0xfe < r) {
      uVar2 = 0xff;
    }
    if (g < 1) {
      g = 0;
    }
    if (0xfe < g) {
      g = 0xff;
    }
    if (b < 1) {
      b = 0;
    }
    if (0xfe < b) {
      b = 0xff;
    }
    String::String(__return_storage_ptr__,0xf,"2;%i;%i;%im",uVar2,(ulong)(uint)g,(ulong)(uint)b);
  }
  else {
    if (r < -0x13) {
      r = -0x14;
    }
    if (0xea < r) {
      r = 0xeb;
    }
    if (g < -0x13) {
      g = -0x14;
    }
    if (0xea < g) {
      g = 0xeb;
    }
    iVar1 = -0x14;
    if (-0x14 < b) {
      iVar1 = b;
    }
    if (0xea < iVar1) {
      iVar1 = 0xeb;
    }
    String::String(__return_storage_ptr__,0xf,"5;%im",
                   (ulong)(((g + 0x14U) / 0x33) * 6 + ((r + 0x14U) / 0x33) * 0x24 +
                           (iVar1 + 0x14U) / 0x33 + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

String Console::rgb(int r, int g, int b) const
{
	const int o = 20;
	if (_colorMode == 2)
		return String(15, "2;%i;%i;%im", clamp(r, 0, 255), clamp(g, 0, 255), clamp(b, 0, 255));
	else
	{
		return String(15, "5;%im", 16 + 36 * (clamp(r + o, 0, 255) * 5 / 255) + 6 * (clamp(g + o, 0, 255) * 5 / 255) + (clamp(b + o, 0, 255) * 5 / 255));
		// if (approx r==g==b) -> use 232 + r/11
	}
}